

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O2

void __thiscall
presolve::HighsPostsolveStack::singletonRow
          (HighsPostsolveStack *this,HighsInt row,HighsInt col,double coef,bool tightenedColLower,
          bool tightenedColUpper)

{
  SingletonRow local_20;
  
  local_20.row = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[row];
  local_20.col = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[col];
  local_20.coef = coef;
  local_20.colLowerTightened = tightenedColLower;
  local_20.colUpperTightened = tightenedColUpper;
  HighsDataStack::push<presolve::HighsPostsolveStack::SingletonRow,_0>
            (&this->reductionValues,&local_20);
  reductionAdded(this,kSingletonRow);
  return;
}

Assistant:

void singletonRow(HighsInt row, HighsInt col, double coef,
                    bool tightenedColLower, bool tightenedColUpper) {
    reductionValues.push(SingletonRow{coef, origRowIndex[row],
                                      origColIndex[col], tightenedColLower,
                                      tightenedColUpper});
    reductionAdded(ReductionType::kSingletonRow);
  }